

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
boost::exception_detail::
clone_impl<boost::exception_detail::error_info_injector<boost::asio::invalid_service_owner>_>::
clone_impl(clone_impl<boost::exception_detail::error_info_injector<boost::asio::invalid_service_owner>_>
           *this,error_info_injector<boost::asio::invalid_service_owner> *x)

{
  *(undefined ***)&this->field_0x38 = &PTR___cxa_pure_virtual_00128f38;
  error_info_injector<boost::asio::invalid_service_owner>::error_info_injector
            (&this->super_error_info_injector<boost::asio::invalid_service_owner>,x);
  *(undefined8 *)
   &(this->super_error_info_injector<boost::asio::invalid_service_owner>).
    super_invalid_service_owner = 0x129070;
  (this->super_error_info_injector<boost::asio::invalid_service_owner>).super_exception.
  _vptr_exception = (_func_int **)0x1290a8;
  *(undefined8 *)&this->field_0x38 = 0x1290e0;
  copy_boost_exception
            (&(this->super_error_info_injector<boost::asio::invalid_service_owner>).super_exception,
             &x->super_exception);
  return;
}

Assistant:

explicit
            clone_impl( T const & x ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }